

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O2

Read<long> __thiscall Omega_h::multiply_each_by<long>(Omega_h *this,Read<long> *a,long b)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  size_t sVar2;
  Read<long> RVar3;
  Write<long> c;
  type_conflict1 f;
  allocator local_69;
  Write<long> local_68;
  type_conflict1 local_58;
  Write<int> local_30;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&local_58,"",&local_69);
  Write<long>::Write(&local_68,(LO)(sVar2 >> 3),(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  Write<long>::Write((Write<int> *)&local_58,(Write<int> *)&local_68);
  Write<long>::Write((Write<int> *)&local_58.a,(Write<int> *)a);
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  local_58.b = b;
  parallel_for<Omega_h::multiply_each_by<long>(Omega_h::Read<long>,long)::_lambda(int)_1_>
            ((LO)(sVar2 >> 3),&local_58,"multiply_each_by");
  Write<long>::Write(&local_30,(Write<int> *)&local_68);
  Read<long>::Read((Read<signed_char> *)this,(Write<long> *)&local_30);
  Write<long>::~Write((Write<long> *)&local_30);
  multiply_each_by<long>(Omega_h::Read<long>,long)::{lambda(int)#1}::~Read
            ((_lambda_int__1_ *)&local_58);
  Write<long>::~Write(&local_68);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<long>)RVar3.write_.shared_alloc_;
}

Assistant:

Read<T> multiply_each_by(Read<T> a, T b) {
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = a[i] * b; };
  parallel_for(a.size(), f, "multiply_each_by");
  return c;
}